

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_1>::calcStatesPartialsFixedScaling
          (BeagleCPUImpl<double,_1,_1> *this,double *destP,int *states1,double *matrices1,
          double *partials2,double *matrices2,double *scaleFactors,int startPattern,int endPattern)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int local_a0;
  int local_9c;
  double local_98;
  double local_90;
  int pad;
  int j;
  double sumB;
  double sumA;
  double tmp;
  double *matrices2Ptr;
  double *pdStack_50;
  int i;
  double oneOverScaleFactor;
  int state1;
  int w;
  int k;
  double *destPtr;
  double *partials2Ptr;
  int matrixOffset;
  int v;
  int l;
  int stateCountModFour;
  int matrixIncr;
  double *matrices2_local;
  
  iVar5 = this->kStateCount + 1;
  iVar2 = this->kStateCount;
  for (state1 = 0; state1 < this->kCategoryCount; state1 = state1 + 1) {
    iVar4 = state1 * this->kPartialsPaddedStateCount * this->kPatternCount +
            this->kPartialsPaddedStateCount * startPattern;
    iVar3 = this->kMatrixSize;
    pdStack_50 = partials2 + iVar4;
    matrices2Ptr = destP + iVar4;
    for (tmp._4_4_ = startPattern; tmp._4_4_ < endPattern; tmp._4_4_ = tmp._4_4_ + 1) {
      tmp._0_4_ = state1 * this->kMatrixSize;
      iVar4 = states1[tmp._4_4_];
      dVar1 = scaleFactors[tmp._4_4_];
      for (j = 0; j < this->kStateCount; j = j + 1) {
        lVar7 = (long)(state1 * iVar3);
        lVar8 = (long)(j * iVar5);
        iVar6 = tmp._0_4_ + iVar4;
        local_90 = 0.0;
        local_98 = 0.0;
        for (local_9c = 0; local_9c < iVar2 / 4 << 2; local_9c = local_9c + 4) {
          auVar14._8_8_ = 0;
          auVar14._0_8_ = matrices2[lVar7 + lVar8 + local_9c];
          auVar9._8_8_ = 0;
          auVar9._0_8_ = pdStack_50[local_9c];
          auVar19._8_8_ = 0;
          auVar19._0_8_ = local_90;
          auVar9 = vfmadd213sd_fma(auVar9,auVar14,auVar19);
          auVar15._8_8_ = 0;
          auVar15._0_8_ = matrices2[lVar7 + lVar8 + (local_9c + 1)];
          auVar10._8_8_ = 0;
          auVar10._0_8_ = pdStack_50[local_9c + 1];
          auVar20._8_8_ = 0;
          auVar20._0_8_ = local_98;
          auVar10 = vfmadd213sd_fma(auVar10,auVar15,auVar20);
          auVar16._8_8_ = 0;
          auVar16._0_8_ = matrices2[lVar7 + lVar8 + (local_9c + 2)];
          auVar11._8_8_ = 0;
          auVar11._0_8_ = pdStack_50[local_9c + 2];
          auVar21._8_8_ = 0;
          auVar21._0_8_ = auVar9._0_8_;
          auVar9 = vfmadd213sd_fma(auVar11,auVar16,auVar21);
          local_90 = auVar9._0_8_;
          auVar17._8_8_ = 0;
          auVar17._0_8_ = matrices2[lVar7 + lVar8 + (local_9c + 3)];
          auVar12._8_8_ = 0;
          auVar12._0_8_ = pdStack_50[local_9c + 3];
          auVar22._8_8_ = 0;
          auVar22._0_8_ = auVar10._0_8_;
          auVar9 = vfmadd213sd_fma(auVar12,auVar17,auVar22);
          local_98 = auVar9._0_8_;
        }
        for (; local_9c < this->kStateCount; local_9c = local_9c + 1) {
          auVar18._8_8_ = 0;
          auVar18._0_8_ = matrices2[lVar7 + lVar8 + local_9c];
          auVar13._8_8_ = 0;
          auVar13._0_8_ = pdStack_50[local_9c];
          auVar23._8_8_ = 0;
          auVar23._0_8_ = local_90;
          auVar9 = vfmadd213sd_fma(auVar13,auVar18,auVar23);
          local_90 = auVar9._0_8_;
        }
        tmp._0_4_ = iVar5 + tmp._0_4_;
        *matrices2Ptr = matrices1[iVar6] * (local_90 + local_98) * (1.0 / dVar1);
        matrices2Ptr = matrices2Ptr + 1;
      }
      for (local_a0 = 0; local_a0 < 1; local_a0 = local_a0 + 1) {
        *matrices2Ptr = 0.0;
        matrices2Ptr = matrices2Ptr + 1;
      }
      pdStack_50 = pdStack_50 + this->kPartialsPaddedStateCount;
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcStatesPartialsFixedScaling(REALTYPE* destP,
                                                                       const int* states1,
                                                                       const REALTYPE* matrices1,
                                                                       const REALTYPE* partials2,
                                                                       const REALTYPE* matrices2,
                                                                       const REALTYPE* scaleFactors,
                                                                       int startPattern,
                                                                       int endPattern) {

    int matrixIncr = kStateCount;

    // increment for the extra column at the end
    matrixIncr += T_PAD;

    int stateCountModFour = (kStateCount / 4) * 4;

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int v = l*kPartialsPaddedStateCount*kPatternCount + kPartialsPaddedStateCount*startPattern;
        int matrixOffset = l*kMatrixSize;
        const REALTYPE* partials2Ptr = &partials2[v];
        REALTYPE* destPtr = &destP[v];
        for (int k = startPattern; k < endPattern; k++) {
            int w = l * kMatrixSize;
            int state1 = states1[k];
            REALTYPE oneOverScaleFactor = REALTYPE(1.0) / scaleFactors[k];
            for (int i = 0; i < kStateCount; i++) {
                const REALTYPE* matrices2Ptr = matrices2 + matrixOffset + i * matrixIncr;
                REALTYPE tmp = matrices1[w + state1];
                REALTYPE sumA = 0.0;
                REALTYPE sumB = 0.0;
                int j = 0;
                for (; j < stateCountModFour; j += 4) {
                    sumA += matrices2Ptr[j + 0] * partials2Ptr[j + 0];
                    sumB += matrices2Ptr[j + 1] * partials2Ptr[j + 1];
                    sumA += matrices2Ptr[j + 2] * partials2Ptr[j + 2];
                    sumB += matrices2Ptr[j + 3] * partials2Ptr[j + 3];
                }
                for (; j < kStateCount; j++) {
                    sumA += matrices2Ptr[j] * partials2Ptr[j];
                }

                w += matrixIncr;

                *(destPtr++) = tmp * (sumA + sumB) * oneOverScaleFactor;
            }
            if (P_PAD) {
                for (int pad = 0; pad < P_PAD; pad++)  {
                    *(destPtr++) = 0.0;
                }
            }
            partials2Ptr += kPartialsPaddedStateCount;
        }
    }
}